

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction_base.cpp
# Opt level: O1

string * cfd::api::TransactionApiBase::AddMultisigSign<cfd::TransactionController>
                   (string *__return_storage_ptr__,
                   function<cfd::TransactionController_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *create_controller,string *tx_hex,Txid *txid,uint32_t vout,
                   vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_list,
                   AddressType address_type,Script *witness_script,Script *redeem_script,
                   bool clear_stack)

{
  uint32_t vout_00;
  Txid *txid_00;
  string *__return_storage_ptr___00;
  long lVar1;
  pointer __x;
  Script unlocking_script;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> signature_data;
  Script script;
  TransactionController txc;
  ScriptBuilder local_180;
  uint32_t local_15c;
  Script local_158;
  Txid *local_118;
  string *local_110;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_108;
  Script local_f0;
  TransactionController local_b8;
  Script local_68;
  
  local_15c = vout;
  local_118 = txid;
  local_110 = __return_storage_ptr__;
  core::Script::Script(&local_68,redeem_script);
  ValidateAddMultisigSign(tx_hex,sign_list,address_type,witness_script,&local_68);
  core::Script::~Script(&local_68);
  if ((create_controller->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*create_controller->_M_invoker)(&local_b8,(_Any_data *)create_controller,tx_hex);
    if (address_type == kP2shAddress) {
      witness_script = redeem_script;
    }
    core::Script::Script(&local_f0,witness_script);
    CreateMultisigSignatureData(&local_108,sign_list,&local_f0);
    __return_storage_ptr___00 = local_110;
    txid_00 = local_118;
    vout_00 = local_15c;
    if (address_type == kP2shAddress) {
      SetP2shMultisigUnlockingScript(&local_158,&local_108,&local_f0);
      TransactionController::SetUnlockingScript(&local_b8,txid_00,vout_00,&local_158);
      core::Script::~Script(&local_158);
    }
    else {
      if (clear_stack) {
        TransactionController::RemoveWitnessStackAll(&local_b8,local_118,local_15c);
      }
      local_158._vptr_Script = (_func_int **)0x0;
      local_158.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      core::ByteData::ByteData((ByteData *)&local_180);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
      emplace_back<cfd::core::ByteData>
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&local_158,
                 (ByteData *)&local_180);
      if (local_180._vptr_ScriptBuilder != (_func_int **)0x0) {
        operator_delete(local_180._vptr_ScriptBuilder);
      }
      if (0 < (long)local_108.
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_108.
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
        lVar1 = (ulong)((long)local_108.
                              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_108.
                             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18 + 1;
        __x = local_108.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_start;
        do {
          std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&local_158
                     ,__x);
          __x = __x + 1;
          lVar1 = lVar1 + -1;
        } while (1 < lVar1);
      }
      core::Script::GetData((ByteData *)&local_180,&local_f0);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&local_158,
                 (value_type *)&local_180);
      if (local_180._vptr_ScriptBuilder != (_func_int **)0x0) {
        operator_delete(local_180._vptr_ScriptBuilder);
      }
      TransactionController::AddWitnessStack
                (&local_b8,txid_00,vout_00,
                 (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&local_158);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&local_158);
      if (address_type == kP2shP2wshAddress) {
        local_180._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00733958;
        local_180.script_byte_array_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_180.script_byte_array_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_180.script_byte_array_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        core::ScriptUtil::CreateP2wshLockingScript(&local_158,&local_f0);
        core::ScriptBuilder::AppendData(&local_180,&local_158);
        core::Script::~Script(&local_158);
        core::ScriptBuilder::Build(&local_158,&local_180);
        TransactionController::SetUnlockingScript(&local_b8,txid_00,vout_00,&local_158);
        core::Script::~Script(&local_158);
        local_180._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00733958;
        if (local_180.script_byte_array_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_180.script_byte_array_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
    }
    AbstractTransactionController::GetHex_abi_cxx11_
              (__return_storage_ptr___00,&local_b8.super_AbstractTransactionController);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_108);
    core::Script::~Script(&local_f0);
    local_b8.super_AbstractTransactionController._vptr_AbstractTransactionController =
         (_func_int **)&PTR__TransactionController_00736ad0;
    core::Transaction::~Transaction(&local_b8.transaction_);
    return __return_storage_ptr___00;
  }
  std::__throw_bad_function_call();
}

Assistant:

std::string TransactionApiBase::AddMultisigSign(
    std::function<T(const std::string&)> create_controller,
    const std::string& tx_hex, const Txid& txid, uint32_t vout,
    const std::vector<SignParameter>& sign_list, AddressType address_type,
    const Script& witness_script, const Script& redeem_script,
    bool clear_stack) {
  ValidateAddMultisigSign(
      tx_hex, sign_list, address_type, witness_script, redeem_script);
  T txc = create_controller(tx_hex);

  // extract pubkeys from redeem script
  // ValidateAddMultiSignRequest ensures that we have one of three correct
  // types.
  Script script = (address_type == AddressType::kP2shAddress) ? redeem_script
                                                              : witness_script;

  std::vector<ByteData> signature_data =
      CreateMultisigSignatureData(sign_list, script);

  // set signatures to target input
  if (address_type == AddressType::kP2shAddress) {
    Script unlocking_script =
        SetP2shMultisigUnlockingScript(signature_data, script);
    txc.SetUnlockingScript(txid, vout, unlocking_script);
  } else {
    SetP2wshMultisigWitnessStack(
        signature_data, script, txid, vout, clear_stack, &txc);

    if (address_type == AddressType::kP2shP2wshAddress) {
      // set p2sh redeem script to unlockking script
      ScriptBuilder sb;
      sb.AppendData(ScriptUtil::CreateP2wshLockingScript(script));
      txc.SetUnlockingScript(txid, vout, sb.Build());
    }
  }

  return txc.GetHex();
}